

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FreeZeroObjVariablePS::execute
          (FreeZeroObjVariablePS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  pointer pDVar1;
  bool bVar2;
  int32_t iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  cpp_dec_float<200U,_int,_void> *pcVar7;
  int32_t *piVar8;
  pointer pnVar9;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar10;
  int *piVar11;
  VarStatus VVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  uint *puVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar20;
  uint *puVar21;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  undefined4 *puVar23;
  uint *puVar24;
  cpp_dec_float<200U,_int,_void> *pcVar25;
  pointer pnVar26;
  pointer pnVar27;
  fpclass_type fVar28;
  fpclass_type fVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  long in_FS_OFFSET;
  byte bVar33;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  up;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_6;
  uint local_704;
  undefined1 local_6f8 [16];
  undefined1 local_6e8 [16];
  undefined1 local_6d8 [16];
  undefined1 local_6c8 [16];
  undefined1 local_6b8 [16];
  undefined1 local_6a8 [16];
  undefined1 local_698 [13];
  undefined3 uStack_68b;
  int iStack_688;
  bool bStack_684;
  undefined8 local_680;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_678;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_670;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_668;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_660;
  cpp_dec_float<200U,_int,_void> local_658;
  undefined1 local_5d8 [32];
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [16];
  undefined1 local_598 [16];
  undefined1 local_588 [16];
  undefined1 local_578 [13];
  undefined3 uStack_56b;
  int iStack_568;
  bool bStack_564;
  undefined8 local_560;
  undefined1 local_558 [32];
  undefined1 local_538 [16];
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  undefined1 local_4f8 [13];
  undefined3 uStack_4eb;
  int iStack_4e8;
  bool bStack_4e4;
  undefined8 local_4e0;
  fpclass_type local_4d8;
  int32_t iStack_4d4;
  undefined8 uStack_4d0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_4c0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_4b8;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [13];
  undefined3 uStack_42b;
  undefined5 uStack_428;
  undefined8 local_420;
  cpp_dec_float<200U,_int,_void> local_410;
  cpp_dec_float<200U,_int,_void> local_390;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_310;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_290;
  cpp_dec_float<200U,_int,_void> local_210;
  cpp_dec_float<200U,_int,_void> local_190;
  uint local_110 [28];
  uint local_a0 [28];
  
  bVar33 = 0;
  iVar6 = this->m_j;
  iVar18 = this->m_old_j;
  if (iVar6 != iVar18) {
    pnVar9 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar21 = (uint *)(pnVar9 + iVar6);
    puVar19 = (uint *)(pnVar9 + iVar18);
    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
      *puVar19 = *puVar21;
      puVar21 = puVar21 + 1;
      puVar19 = puVar19 + 1;
    }
    pnVar9[iVar18].m_backend.exp = pnVar9[iVar6].m_backend.exp;
    pnVar9[iVar18].m_backend.neg = pnVar9[iVar6].m_backend.neg;
    iVar3 = pnVar9[iVar6].m_backend.prec_elem;
    pnVar9[iVar18].m_backend.fpclass = pnVar9[iVar6].m_backend.fpclass;
    pnVar9[iVar18].m_backend.prec_elem = iVar3;
    iVar6 = this->m_j;
    pnVar9 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar18 = this->m_old_j;
    puVar21 = (uint *)(pnVar9 + iVar6);
    puVar19 = (uint *)(pnVar9 + iVar18);
    for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
      *puVar19 = *puVar21;
      puVar21 = puVar21 + 1;
      puVar19 = puVar19 + 1;
    }
    pnVar9[iVar18].m_backend.exp = pnVar9[iVar6].m_backend.exp;
    pnVar9[iVar18].m_backend.neg = pnVar9[iVar6].m_backend.neg;
    iVar3 = pnVar9[iVar6].m_backend.prec_elem;
    pnVar9[iVar18].m_backend.fpclass = pnVar9[iVar6].m_backend.fpclass;
    pnVar9[iVar18].m_backend.prec_elem = iVar3;
    cStatus->data[this->m_old_j] = cStatus->data[this->m_j];
  }
  iVar6 = (this->m_col).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused;
  if (0 < iVar6) {
    lVar13 = (long)(this->m_old_i - iVar6);
    lVar15 = lVar13 * 0x20 + 0x3e;
    lVar30 = 0x20;
    lVar31 = 0;
    do {
      uVar16 = (((this->m_col).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem)->val).m_backend.data._M_elems[lVar30];
      pnVar9 = (s->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar21 = (pnVar9->m_backend).data._M_elems + lVar15;
      puVar19 = (uint *)(pnVar9 + (int)uVar16);
      puVar24 = puVar21 + 0xffffffffffffffe2;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        *puVar24 = *puVar19;
        puVar19 = puVar19 + 1;
        puVar24 = puVar24 + 1;
      }
      puVar21[0xfffffffffffffffe] = pnVar9[(int)uVar16].m_backend.exp;
      *(bool *)(puVar21 + 0xffffffffffffffff) = pnVar9[(int)uVar16].m_backend.neg;
      iVar3 = pnVar9[(int)uVar16].m_backend.prec_elem;
      puVar21[0] = pnVar9[(int)uVar16].m_backend.fpclass;
      puVar21[1] = iVar3;
      pnVar9 = (y->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar21 = (pnVar9->m_backend).data._M_elems + lVar15 + -0x1e;
      puVar19 = (uint *)(pnVar9 + (int)uVar16);
      puVar24 = puVar21;
      for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
        *puVar24 = *puVar19;
        puVar19 = puVar19 + 1;
        puVar24 = puVar24 + 1;
      }
      puVar21[0x1c] = pnVar9[(int)uVar16].m_backend.exp;
      *(bool *)(puVar21 + 0x1d) = pnVar9[(int)uVar16].m_backend.neg;
      *(undefined8 *)(puVar21 + 0x1e) = *(undefined8 *)&pnVar9[(int)uVar16].m_backend.fpclass;
      rStatus->data[lVar13 + lVar31 + 1] = rStatus->data[(int)uVar16];
      lVar31 = lVar31 + 1;
      iVar6 = (this->m_col).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused;
      lVar30 = lVar30 + 0x21;
      lVar15 = lVar15 + 0x20;
    } while (lVar31 < iVar6);
  }
  local_4b8.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  local_4b8.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  local_4b8.
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  local_4b8._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a69e0;
  local_4b8.theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  iVar18 = 2;
  if (0 < iVar6) {
    iVar18 = iVar6;
  }
  local_670 = cStatus;
  local_668 = r;
  local_660 = y;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&local_4b8,iVar18);
  local_4c0 = s;
  if (this->m_loFree == false) {
    ::soplex::infinity::__tls_init();
    local_560._0_4_ = cpp_dec_float_finite;
    local_560._4_4_ = 0x1c;
    local_5d8._0_16_ = (undefined1  [16])0x0;
    local_5d8._16_16_ = (undefined1  [16])0x0;
    local_5b8 = (undefined1  [16])0x0;
    local_5a8 = (undefined1  [16])0x0;
    local_598 = (undefined1  [16])0x0;
    local_588 = (undefined1  [16])0x0;
    local_578 = SUB1613((undefined1  [16])0x0,0);
    uStack_56b = 0;
    iStack_568 = 0;
    bStack_564 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_5d8,
               (double)(*(ulong *)(in_FS_OFFSET + -8) ^ (ulong)DAT_005f4010));
    if ((int)((ulong)((long)(this->m_rows).data.
                            super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_rows).data.
                           super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5) < 1) {
      local_704 = 0xffffffff;
    }
    else {
      local_678 = &(this->m_lRhs).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      local_704 = 0xffffffff;
      lVar13 = 0;
      do {
        local_4e0._0_4_ = cpp_dec_float_finite;
        local_4e0._4_4_ = 0x1c;
        local_558._0_16_ = (undefined1  [16])0x0;
        local_558._16_16_ = (undefined1  [16])0x0;
        local_538 = (undefined1  [16])0x0;
        local_528 = (undefined1  [16])0x0;
        local_518 = (undefined1  [16])0x0;
        local_508 = (undefined1  [16])0x0;
        local_4f8 = SUB1613((undefined1  [16])0x0,0);
        uStack_4eb = 0;
        iStack_4e8 = 0;
        bStack_4e4 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_558,0.0);
        pDVar1 = (this->m_rows).data.
                 super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar6 = pDVar1[lVar13].
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused;
        if (0 < iVar6) {
          lVar15 = 0;
          lVar30 = 0;
          do {
            pNVar10 = pDVar1[lVar13].
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
            iVar18 = *(int *)((long)(&pNVar10->val + 1) + lVar15);
            if (iVar18 != this->m_j) {
              pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)(pNVar10->val).m_backend.data._M_elems + lVar15);
              pcVar25 = &(x->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar18].m_backend;
              local_680._0_4_ = cpp_dec_float_finite;
              local_680._4_4_ = 0x1c;
              local_6f8 = (undefined1  [16])0x0;
              local_6e8 = (undefined1  [16])0x0;
              local_6d8 = (undefined1  [16])0x0;
              local_6c8 = (undefined1  [16])0x0;
              local_6b8 = (undefined1  [16])0x0;
              local_6a8 = (undefined1  [16])0x0;
              local_698 = SUB1613((undefined1  [16])0x0,0);
              uStack_68b = 0;
              iStack_688 = 0;
              bStack_684 = false;
              pcVar7 = pcVar22;
              if (((cpp_dec_float<200U,_int,_void> *)local_6f8 != pcVar25) &&
                 (pcVar7 = pcVar25, pcVar22 != (cpp_dec_float<200U,_int,_void> *)local_6f8)) {
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_6f8;
                for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                  (pcVar25->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
                  pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar22 + (ulong)bVar33 * -8 + 4);
                  pcVar25 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar25 + (ulong)bVar33 * -8 + 4);
                }
                iStack_688 = *(int *)((long)(&(pNVar10->val).m_backend.data + 1) + lVar15);
                bStack_684 = *(bool *)((long)(&(pNVar10->val).m_backend.data + 1) + lVar15 + 4);
                local_680 = *(undefined8 *)((long)(&(pNVar10->val).m_backend.data + 1) + lVar15 + 8)
                ;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_6f8,pcVar7);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_558,
                         (cpp_dec_float<200U,_int,_void> *)local_6f8);
              iVar6 = pDVar1[lVar13].
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused;
            }
            lVar30 = lVar30 + 1;
            lVar15 = lVar15 + 0x84;
          } while (lVar30 < iVar6);
        }
        uVar16 = (uint)lVar13;
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[](&local_310,local_678,uVar16);
        uVar4 = local_4e0;
        bVar2 = bStack_4e4;
        iVar6 = iStack_4e8;
        pnVar20 = &local_310;
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_6f8;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pcVar22->data)._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
          pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar20 + ((ulong)bVar33 * -2 + 1) * 4);
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar33 * -8 + 4);
        }
        iStack_688 = local_310.m_backend.exp;
        bStack_684 = local_310.m_backend.neg;
        local_680._0_4_ = local_310.m_backend.fpclass;
        local_680._4_4_ = local_310.m_backend.prec_elem;
        fVar28 = local_310.m_backend.fpclass;
        if ((local_310.m_backend.neg == true) &&
           (local_6f8._0_4_ != 0 || fVar28 != cpp_dec_float_finite)) {
          bStack_684 = false;
        }
        puVar21 = (uint *)local_558;
        pcVar22 = &local_658;
        for (lVar15 = 0x1c; uVar5 = local_4e0, lVar15 != 0; lVar15 = lVar15 + -1) {
          (pcVar22->data)._M_elems[0] = *puVar21;
          puVar21 = puVar21 + (ulong)bVar33 * -2 + 1;
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar33 * -8 + 4);
        }
        local_658.exp = iVar6;
        local_658.neg = bVar2;
        local_4e0._0_4_ = (fpclass_type)uVar4;
        local_4e0._4_4_ = SUB84(uVar4,4);
        local_658.fpclass = (fpclass_type)local_4e0;
        local_658.prec_elem = local_4e0._4_4_;
        fVar29 = (fpclass_type)uVar4;
        if ((bVar2 != false) && (fVar29 != cpp_dec_float_finite || local_658.data._M_elems[0] != 0))
        {
          local_658.neg = (bool)(bVar2 ^ 1);
        }
        local_4e0 = uVar5;
        if (fVar29 == cpp_dec_float_NaN || fVar28 == cpp_dec_float_NaN) {
LAB_00578b79:
          pcVar22 = &local_658;
          pcVar7 = &local_410;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            (pcVar7->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar33 * -8 + 4);
            pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + ((ulong)bVar33 * -2 + 1) * 4)
            ;
          }
          local_410.exp = local_658.exp;
          local_410.neg = local_658.neg;
          piVar8 = &local_658.prec_elem;
        }
        else {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_6f8,&local_658);
          if (iVar6 < 1) {
            fVar29 = local_658.fpclass;
            goto LAB_00578b79;
          }
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_6f8;
          pcVar7 = &local_410;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            (pcVar7->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar33 * -8 + 4);
            pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + ((ulong)bVar33 * -2 + 1) * 4)
            ;
          }
          local_410.exp = iStack_688;
          local_410.neg = bStack_684;
          piVar8 = (int32_t *)((long)&local_680 + 4);
          fVar29 = (fpclass_type)local_680;
        }
        local_410.fpclass = fVar29;
        local_410.prec_elem = *piVar8;
        if (fVar29 != cpp_dec_float_NaN) {
          local_680._0_4_ = cpp_dec_float_finite;
          local_680._4_4_ = 0x1c;
          local_6f8 = (undefined1  [16])0x0;
          local_6e8 = (undefined1  [16])0x0;
          local_6d8 = (undefined1  [16])0x0;
          local_6c8 = (undefined1  [16])0x0;
          local_6b8 = (undefined1  [16])0x0;
          local_6a8 = (undefined1  [16])0x0;
          local_698 = SUB1613((undefined1  [16])0x0,0);
          uStack_68b = 0;
          iStack_688 = 0;
          bStack_684 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_6f8,1.0);
          iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_410,(cpp_dec_float<200U,_int,_void> *)local_6f8);
          if (iVar6 < 0) {
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_410,1.0);
          }
        }
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_390,local_678,uVar16);
        local_680._0_4_ = cpp_dec_float_finite;
        local_680._4_4_ = 0x1c;
        local_6f8 = (undefined1  [16])0x0;
        local_6e8 = (undefined1  [16])0x0;
        local_6d8 = (undefined1  [16])0x0;
        local_6c8 = (undefined1  [16])0x0;
        local_6b8 = (undefined1  [16])0x0;
        local_6a8 = (undefined1  [16])0x0;
        local_698 = SUB1613((undefined1  [16])0x0,0);
        uStack_68b = 0;
        iStack_688 = 0;
        bStack_684 = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_6f8,&local_390,&local_410);
        local_420._0_4_ = cpp_dec_float_finite;
        local_420._4_4_ = 0x1c;
        local_498 = (undefined1  [16])0x0;
        local_488 = (undefined1  [16])0x0;
        local_478 = (undefined1  [16])0x0;
        local_468 = (undefined1  [16])0x0;
        local_458 = (undefined1  [16])0x0;
        local_448 = (undefined1  [16])0x0;
        local_438 = SUB1613((undefined1  [16])0x0,0);
        uStack_42b = 0;
        uStack_428._0_4_ = 0;
        uStack_428._4_1_ = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_498,
                   (cpp_dec_float<200U,_int,_void> *)local_558,&local_410);
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_6f8;
        pcVar7 = &local_658;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pcVar7->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar33 * -8 + 4);
          pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar33 * -8 + 4);
        }
        local_658.exp = iStack_688;
        local_658.neg = bStack_684;
        local_658.fpclass = (fpclass_type)local_680;
        local_658.prec_elem = local_680._4_4_;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&local_658,(cpp_dec_float<200U,_int,_void> *)local_498);
        bVar2 = local_658.neg;
        iVar6 = local_658.exp;
        pcVar22 = &local_658;
        puVar21 = local_110;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          *puVar21 = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar33 * -8 + 4);
          puVar21 = puVar21 + (ulong)bVar33 * -2 + 1;
        }
        local_4d8 = local_658.fpclass;
        iStack_4d4 = local_658.prec_elem;
        uStack_4d0 = 0;
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_210);
        puVar21 = local_110;
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_6f8;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pcVar22->data)._M_elems[0] = *puVar21;
          puVar21 = puVar21 + (ulong)bVar33 * -2 + 1;
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar33 * -8 + 4);
        }
        iStack_688 = iVar6;
        bStack_684 = bVar2;
        fVar28 = local_4d8;
        local_680._0_4_ = local_4d8;
        local_680._4_4_ = iStack_4d4;
        if ((bVar2 != false) && (local_6f8._0_4_ != 0 || fVar28 != cpp_dec_float_finite)) {
          bStack_684 = (bool)(bVar2 ^ 1);
        }
        if ((fVar28 != cpp_dec_float_NaN) && (local_210.fpclass != cpp_dec_float_NaN)) {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_6f8,&local_210);
          if (iVar6 < 1) {
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_658,0.0);
          }
        }
        pcVar22 = &local_658;
        pcVar7 = &local_390;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pcVar7->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + ((ulong)bVar33 * -2 + 1) * 4)
          ;
          pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar33 * -8 + 4);
        }
        local_390.exp = local_658.exp;
        local_390.neg = local_658.neg;
        local_390.fpclass = local_658.fpclass;
        local_390.prec_elem = local_658.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&local_390,&local_410);
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_498,
                     &pDVar1[lVar13].
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ,this->m_j);
        local_680._0_4_ = cpp_dec_float_finite;
        local_680._4_4_ = 0x1c;
        local_6f8 = (undefined1  [16])0x0;
        local_6e8 = (undefined1  [16])0x0;
        local_6d8 = (undefined1  [16])0x0;
        local_6c8 = (undefined1  [16])0x0;
        local_6b8 = (undefined1  [16])0x0;
        local_6a8 = (undefined1  [16])0x0;
        local_698 = SUB1613((undefined1  [16])0x0,0);
        uStack_68b = 0;
        iStack_688 = 0;
        bStack_684 = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_6f8,&local_390,
                   (cpp_dec_float<200U,_int,_void> *)local_498);
        DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(&local_4b8,uVar16,
              (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_558);
        if ((((fpclass_type)local_680 != cpp_dec_float_NaN) &&
            ((fpclass_type)local_560 != cpp_dec_float_NaN)) &&
           (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_6f8,
                               (cpp_dec_float<200U,_int,_void> *)local_5d8), 0 < iVar6)) {
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_6f8;
          puVar21 = (uint *)local_5d8;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            *puVar21 = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar33 * -8 + 4);
            puVar21 = puVar21 + (ulong)bVar33 * -2 + 1;
          }
          iStack_568 = iStack_688;
          bStack_564 = bStack_684;
          local_560._0_4_ = (fpclass_type)local_680;
          local_560._4_4_ = local_680._4_4_;
          local_704 = uVar16;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < (int)((ulong)((long)(this->m_rows).data.
                                            super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->m_rows).data.
                                           super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5));
    }
    if ((((this->m_bnd).m_backend.fpclass != cpp_dec_float_NaN) &&
        ((fpclass_type)local_560 != cpp_dec_float_NaN)) &&
       (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&(this->m_bnd).m_backend,(cpp_dec_float<200U,_int,_void> *)local_5d8),
       0 < iVar6)) goto LAB_00579038;
  }
  else {
    ::soplex::infinity::__tls_init();
    local_560._0_4_ = cpp_dec_float_finite;
    local_560._4_4_ = 0x1c;
    local_5d8._0_16_ = (undefined1  [16])0x0;
    local_5d8._16_16_ = (undefined1  [16])0x0;
    local_5b8 = (undefined1  [16])0x0;
    local_5a8 = (undefined1  [16])0x0;
    local_598 = (undefined1  [16])0x0;
    local_588 = (undefined1  [16])0x0;
    local_578 = SUB1613((undefined1  [16])0x0,0);
    uStack_56b = 0;
    iStack_568 = 0;
    bStack_564 = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)local_5d8,*(double *)(in_FS_OFFSET + -8));
    if ((int)((ulong)((long)(this->m_rows).data.
                            super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->m_rows).data.
                           super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5) < 1) {
      local_704 = 0xffffffff;
    }
    else {
      local_678 = &(this->m_lRhs).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ;
      local_704 = 0xffffffff;
      lVar13 = 0;
      do {
        local_4e0._0_4_ = cpp_dec_float_finite;
        local_4e0._4_4_ = 0x1c;
        local_558._0_16_ = (undefined1  [16])0x0;
        local_558._16_16_ = (undefined1  [16])0x0;
        local_538 = (undefined1  [16])0x0;
        local_528 = (undefined1  [16])0x0;
        local_518 = (undefined1  [16])0x0;
        local_508 = (undefined1  [16])0x0;
        local_4f8 = SUB1613((undefined1  [16])0x0,0);
        uStack_4eb = 0;
        iStack_4e8 = 0;
        bStack_4e4 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)local_558,0.0);
        pDVar1 = (this->m_rows).data.
                 super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar6 = pDVar1[lVar13].
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused;
        if (0 < iVar6) {
          lVar15 = 0;
          lVar30 = 0;
          do {
            pNVar10 = pDVar1[lVar13].
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .m_elem;
            iVar18 = *(int *)((long)(&pNVar10->val + 1) + lVar15);
            if (iVar18 != this->m_j) {
              pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                        ((long)(pNVar10->val).m_backend.data._M_elems + lVar15);
              pcVar25 = &(x->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar18].m_backend;
              local_680._0_4_ = cpp_dec_float_finite;
              local_680._4_4_ = 0x1c;
              local_6f8 = (undefined1  [16])0x0;
              local_6e8 = (undefined1  [16])0x0;
              local_6d8 = (undefined1  [16])0x0;
              local_6c8 = (undefined1  [16])0x0;
              local_6b8 = (undefined1  [16])0x0;
              local_6a8 = (undefined1  [16])0x0;
              local_698 = SUB1613((undefined1  [16])0x0,0);
              uStack_68b = 0;
              iStack_688 = 0;
              bStack_684 = false;
              pcVar7 = pcVar22;
              if (((cpp_dec_float<200U,_int,_void> *)local_6f8 != pcVar25) &&
                 (pcVar7 = pcVar25, pcVar22 != (cpp_dec_float<200U,_int,_void> *)local_6f8)) {
                pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_6f8;
                for (lVar31 = 0x1c; lVar31 != 0; lVar31 = lVar31 + -1) {
                  (pcVar25->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
                  pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar22 + (ulong)bVar33 * -8 + 4);
                  pcVar25 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar25 + (ulong)bVar33 * -8 + 4);
                }
                iStack_688 = *(int *)((long)(&(pNVar10->val).m_backend.data + 1) + lVar15);
                bStack_684 = *(bool *)((long)(&(pNVar10->val).m_backend.data + 1) + lVar15 + 4);
                local_680 = *(undefined8 *)((long)(&(pNVar10->val).m_backend.data + 1) + lVar15 + 8)
                ;
              }
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                        ((cpp_dec_float<200U,_int,_void> *)local_6f8,pcVar7);
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                        ((cpp_dec_float<200U,_int,_void> *)local_558,
                         (cpp_dec_float<200U,_int,_void> *)local_6f8);
              iVar6 = pDVar1[lVar13].
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused;
            }
            lVar30 = lVar30 + 1;
            lVar15 = lVar15 + 0x84;
          } while (lVar30 < iVar6);
        }
        uVar16 = (uint)lVar13;
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[](&local_290,local_678,uVar16);
        uVar4 = local_4e0;
        bVar2 = bStack_4e4;
        iVar6 = iStack_4e8;
        pnVar20 = &local_290;
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_6f8;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pcVar22->data)._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
          pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar20 + ((ulong)bVar33 * -2 + 1) * 4);
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar33 * -8 + 4);
        }
        iStack_688 = local_290.m_backend.exp;
        bStack_684 = local_290.m_backend.neg;
        local_680._0_4_ = local_290.m_backend.fpclass;
        local_680._4_4_ = local_290.m_backend.prec_elem;
        fVar28 = local_290.m_backend.fpclass;
        if ((local_290.m_backend.neg == true) &&
           (local_6f8._0_4_ != 0 || fVar28 != cpp_dec_float_finite)) {
          bStack_684 = false;
        }
        puVar21 = (uint *)local_558;
        pcVar22 = &local_658;
        for (lVar15 = 0x1c; uVar5 = local_4e0, lVar15 != 0; lVar15 = lVar15 + -1) {
          (pcVar22->data)._M_elems[0] = *puVar21;
          puVar21 = puVar21 + (ulong)bVar33 * -2 + 1;
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar33 * -8 + 4);
        }
        local_658.exp = iVar6;
        local_658.neg = bVar2;
        local_4e0._0_4_ = (fpclass_type)uVar4;
        local_4e0._4_4_ = SUB84(uVar4,4);
        local_658.fpclass = (fpclass_type)local_4e0;
        local_658.prec_elem = local_4e0._4_4_;
        fVar29 = (fpclass_type)uVar4;
        if ((bVar2 != false) && (fVar29 != cpp_dec_float_finite || local_658.data._M_elems[0] != 0))
        {
          local_658.neg = (bool)(bVar2 ^ 1);
        }
        local_4e0 = uVar5;
        if (fVar29 == cpp_dec_float_NaN || fVar28 == cpp_dec_float_NaN) {
LAB_005783cc:
          pcVar22 = &local_658;
          pcVar7 = &local_410;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            (pcVar7->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar33 * -8 + 4);
            pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar33 * -8 + 4);
          }
          local_410.exp = local_658.exp;
          local_410.neg = local_658.neg;
          piVar8 = &local_658.prec_elem;
        }
        else {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_6f8,&local_658);
          if (iVar6 < 1) {
            fVar29 = local_658.fpclass;
            goto LAB_005783cc;
          }
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_6f8;
          pcVar7 = &local_410;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            (pcVar7->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar33 * -8 + 4);
            pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar33 * -8 + 4);
          }
          local_410.exp = iStack_688;
          local_410.neg = bStack_684;
          piVar8 = (int32_t *)((long)&local_680 + 4);
          fVar29 = (fpclass_type)local_680;
        }
        local_410.fpclass = fVar29;
        local_410.prec_elem = *piVar8;
        if (fVar29 != cpp_dec_float_NaN) {
          local_680._0_4_ = cpp_dec_float_finite;
          local_680._4_4_ = 0x1c;
          local_6f8 = (undefined1  [16])0x0;
          local_6e8 = (undefined1  [16])0x0;
          local_6d8 = (undefined1  [16])0x0;
          local_6c8 = (undefined1  [16])0x0;
          local_6b8 = (undefined1  [16])0x0;
          local_6a8 = (undefined1  [16])0x0;
          local_698 = SUB1613((undefined1  [16])0x0,0);
          uStack_68b = 0;
          iStack_688 = 0;
          bStack_684 = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)local_6f8,1.0);
          iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_410,(cpp_dec_float<200U,_int,_void> *)local_6f8);
          if (iVar6 < 0) {
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_410,1.0);
          }
        }
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_390,local_678,uVar16);
        local_680._0_4_ = cpp_dec_float_finite;
        local_680._4_4_ = 0x1c;
        local_6f8 = (undefined1  [16])0x0;
        local_6e8 = (undefined1  [16])0x0;
        local_6d8 = (undefined1  [16])0x0;
        local_6c8 = (undefined1  [16])0x0;
        local_6b8 = (undefined1  [16])0x0;
        local_6a8 = (undefined1  [16])0x0;
        local_698 = SUB1613((undefined1  [16])0x0,0);
        uStack_68b = 0;
        iStack_688 = 0;
        bStack_684 = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_6f8,&local_390,&local_410);
        local_420._0_4_ = cpp_dec_float_finite;
        local_420._4_4_ = 0x1c;
        local_498 = (undefined1  [16])0x0;
        local_488 = (undefined1  [16])0x0;
        local_478 = (undefined1  [16])0x0;
        local_468 = (undefined1  [16])0x0;
        local_458 = (undefined1  [16])0x0;
        local_448 = (undefined1  [16])0x0;
        local_438 = SUB1613((undefined1  [16])0x0,0);
        uStack_42b = 0;
        uStack_428._0_4_ = 0;
        uStack_428._4_1_ = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_498,
                   (cpp_dec_float<200U,_int,_void> *)local_558,&local_410);
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_6f8;
        pcVar7 = &local_658;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pcVar7->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar33 * -8 + 4);
          pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar33 * -8 + 4);
        }
        local_658.exp = iStack_688;
        local_658.neg = bStack_684;
        local_658.fpclass = (fpclass_type)local_680;
        local_658.prec_elem = local_680._4_4_;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&local_658,(cpp_dec_float<200U,_int,_void> *)local_498);
        bVar2 = local_658.neg;
        iVar6 = local_658.exp;
        pcVar22 = &local_658;
        puVar21 = local_a0;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          *puVar21 = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar33 * -8 + 4);
          puVar21 = puVar21 + (ulong)bVar33 * -2 + 1;
        }
        local_4d8 = local_658.fpclass;
        iStack_4d4 = local_658.prec_elem;
        uStack_4d0 = 0;
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_190);
        puVar21 = local_a0;
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_6f8;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pcVar22->data)._M_elems[0] = *puVar21;
          puVar21 = puVar21 + (ulong)bVar33 * -2 + 1;
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar33 * -8 + 4);
        }
        iStack_688 = iVar6;
        bStack_684 = bVar2;
        fVar28 = local_4d8;
        local_680._0_4_ = local_4d8;
        local_680._4_4_ = iStack_4d4;
        if ((bVar2 != false) && (local_6f8._0_4_ != 0 || fVar28 != cpp_dec_float_finite)) {
          bStack_684 = (bool)(bVar2 ^ 1);
        }
        if ((fVar28 != cpp_dec_float_NaN) && (local_190.fpclass != cpp_dec_float_NaN)) {
          iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)local_6f8,&local_190);
          if (iVar6 < 1) {
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_658,0.0);
          }
        }
        pcVar22 = &local_658;
        pcVar7 = &local_390;
        for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
          (pcVar7->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + ((ulong)bVar33 * -2 + 1) * 4)
          ;
          pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar33 * -8 + 4);
        }
        local_390.exp = local_658.exp;
        local_390.neg = local_658.neg;
        local_390.fpclass = local_658.fpclass;
        local_390.prec_elem = local_658.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&local_390,&local_410);
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_498,
                     &pDVar1[lVar13].
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ,this->m_j);
        local_680._0_4_ = cpp_dec_float_finite;
        local_680._4_4_ = 0x1c;
        local_6f8 = (undefined1  [16])0x0;
        local_6e8 = (undefined1  [16])0x0;
        local_6d8 = (undefined1  [16])0x0;
        local_6c8 = (undefined1  [16])0x0;
        local_6b8 = (undefined1  [16])0x0;
        local_6a8 = (undefined1  [16])0x0;
        local_698 = SUB1613((undefined1  [16])0x0,0);
        uStack_68b = 0;
        iStack_688 = 0;
        bStack_684 = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_6f8,&local_390,
                   (cpp_dec_float<200U,_int,_void> *)local_498);
        DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(&local_4b8,uVar16,
              (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_558);
        if ((((fpclass_type)local_680 != cpp_dec_float_NaN) &&
            ((fpclass_type)local_560 != cpp_dec_float_NaN)) &&
           (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              ((cpp_dec_float<200U,_int,_void> *)local_6f8,
                               (cpp_dec_float<200U,_int,_void> *)local_5d8), iVar6 < 0)) {
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_6f8;
          puVar21 = (uint *)local_5d8;
          for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
            *puVar21 = (pcVar22->data)._M_elems[0];
            pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar33 * -8 + 4);
            puVar21 = puVar21 + (ulong)bVar33 * -2 + 1;
          }
          iStack_568 = iStack_688;
          bStack_564 = bStack_684;
          local_560._0_4_ = (fpclass_type)local_680;
          local_560._4_4_ = local_680._4_4_;
          local_704 = uVar16;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < (int)((ulong)((long)(this->m_rows).data.
                                            super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->m_rows).data.
                                           super__Vector_base<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 5));
    }
    if ((((this->m_bnd).m_backend.fpclass != cpp_dec_float_NaN) &&
        ((fpclass_type)local_560 != cpp_dec_float_NaN)) &&
       (iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&(this->m_bnd).m_backend,(cpp_dec_float<200U,_int,_void> *)local_5d8),
       iVar6 < 0)) {
LAB_00579038:
      iVar6 = this->m_j;
      pnVar27 = (x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pnVar9 = pnVar27 + iVar6;
      pnVar20 = &this->m_bnd;
      pnVar26 = pnVar9;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pnVar26->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + (ulong)bVar33 * -8 + 4);
        pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar33 * -2 + 1) * 4);
      }
      pnVar27[iVar6].m_backend.exp = (this->m_bnd).m_backend.exp;
      pnVar27[iVar6].m_backend.neg = (this->m_bnd).m_backend.neg;
      pnVar27[iVar6].m_backend.fpclass = (this->m_bnd).m_backend.fpclass;
      piVar8 = &(this->m_bnd).m_backend.prec_elem;
      local_704 = 0xffffffff;
      goto LAB_005790d7;
    }
  }
  piVar8 = (int32_t *)((long)&local_560 + 4);
  iVar6 = this->m_j;
  pnVar27 = (x->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pnVar9 = pnVar27 + iVar6;
  puVar23 = (undefined4 *)local_5d8;
  pnVar26 = pnVar9;
  for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
    (pnVar26->m_backend).data._M_elems[0] = *puVar23;
    puVar23 = puVar23 + (ulong)bVar33 * -2 + 1;
    pnVar26 = (pointer)((long)pnVar26 + ((ulong)bVar33 * -2 + 1) * 4);
  }
  pnVar27[iVar6].m_backend.exp = iStack_568;
  pnVar27[iVar6].m_backend.neg = bStack_564;
  pnVar27[iVar6].m_backend.fpclass = (fpclass_type)local_560;
LAB_005790d7:
  (pnVar9->m_backend).prec_elem = *piVar8;
  if (0 < (this->m_col).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar15 = 0;
    lVar13 = 0;
    do {
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_658,
                   &local_4b8.
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,(int)lVar13);
      pNVar10 = (this->m_col).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .m_elem;
      pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                ((long)(pNVar10->val).m_backend.data._M_elems + lVar15);
      pcVar25 = &(x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
      local_560._0_4_ = cpp_dec_float_finite;
      local_560._4_4_ = 0x1c;
      local_5d8._0_16_ = (undefined1  [16])0x0;
      local_5d8._16_16_ = (undefined1  [16])0x0;
      local_5b8 = (undefined1  [16])0x0;
      local_5a8 = (undefined1  [16])0x0;
      local_598 = (undefined1  [16])0x0;
      local_588 = (undefined1  [16])0x0;
      local_578 = SUB1613((undefined1  [16])0x0,0);
      uStack_56b = 0;
      iStack_568 = 0;
      bStack_564 = false;
      pcVar7 = pcVar22;
      if (((cpp_dec_float<200U,_int,_void> *)local_5d8 != pcVar25) &&
         (pcVar7 = pcVar25, pcVar22 != (cpp_dec_float<200U,_int,_void> *)local_5d8)) {
        pcVar25 = (cpp_dec_float<200U,_int,_void> *)local_5d8;
        for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
          (pcVar25->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar33 * -8 + 4);
          pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar33 * -8 + 4);
        }
        iStack_568 = *(int *)((long)(&(pNVar10->val).m_backend.data + 1) + lVar15);
        bStack_564 = *(bool *)((long)(&(pNVar10->val).m_backend.data + 1) + lVar15 + 4);
        local_560 = *(undefined8 *)((long)(&(pNVar10->val).m_backend.data + 1) + lVar15 + 8);
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                ((cpp_dec_float<200U,_int,_void> *)local_5d8,pcVar7);
      pcVar22 = &local_658;
      pcVar7 = (cpp_dec_float<200U,_int,_void> *)local_6f8;
      for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
        (pcVar7->data)._M_elems[0] =
             (((cpp_dec_float<200U,_int,_void> *)&pcVar22->data)->data)._M_elems[0];
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + ((ulong)bVar33 * -2 + 1) * 4);
        pcVar7 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar7 + (ulong)bVar33 * -8 + 4);
      }
      iStack_688 = local_658.exp;
      bStack_684 = local_658.neg;
      local_680._0_4_ = local_658.fpclass;
      local_680._4_4_ = local_658.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                ((cpp_dec_float<200U,_int,_void> *)local_6f8,
                 (cpp_dec_float<200U,_int,_void> *)local_5d8);
      iVar6 = *(int *)((long)(&((this->m_col).
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               .m_elem)->val + 1) + lVar15);
      pnVar9 = (local_4c0->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_6f8;
      pnVar27 = pnVar9 + iVar6;
      for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
        (pnVar27->m_backend).data._M_elems[0] = (pcVar22->data)._M_elems[0];
        pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar33 * -8 + 4);
        pnVar27 = (pointer)((long)pnVar27 + ((ulong)bVar33 * -2 + 1) * 4);
      }
      pnVar9[iVar6].m_backend.exp = iStack_688;
      pnVar9[iVar6].m_backend.neg = bStack_684;
      pnVar9[iVar6].m_backend.fpclass = (fpclass_type)local_680;
      pnVar9[iVar6].m_backend.prec_elem = local_680._4_4_;
      lVar13 = lVar13 + 1;
      lVar15 = lVar15 + 0x84;
    } while (lVar13 < (this->m_col).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)
             ((local_668->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
  if (0 < (this->m_col).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar13 = 0x80;
    lVar15 = 0;
    do {
      iVar6 = *(int *)((long)(((this->m_col).
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .m_elem)->val).m_backend.data._M_elems + lVar13);
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_6f8,
                   &(this->m_rowObj).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ,iVar6);
      pnVar9 = (local_660->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_6f8;
      pnVar27 = pnVar9 + iVar6;
      for (lVar30 = 0x1c; lVar30 != 0; lVar30 = lVar30 + -1) {
        (pnVar27->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + ((ulong)bVar33 * -2 + 1) * 4);
        pnVar27 = (pointer)((long)pnVar27 + ((ulong)bVar33 * -2 + 1) * 4);
      }
      pnVar9[iVar6].m_backend.exp = iStack_688;
      pnVar9[iVar6].m_backend.neg = bStack_684;
      pnVar9[iVar6].m_backend.fpclass = (fpclass_type)local_680;
      pnVar9[iVar6].m_backend.prec_elem = local_680._4_4_;
      lVar15 = lVar15 + 1;
      iVar6 = (this->m_col).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused;
      lVar13 = lVar13 + 0x84;
    } while (lVar15 < iVar6);
    if (0 < iVar6) {
      uVar32 = (ulong)local_704;
      lVar13 = 0x80;
      uVar17 = 0;
      do {
        if (uVar32 == uVar17) {
          local_670->data[this->m_j] = BASIC;
          pNVar10 = (this->m_col).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem;
          fVar28 = pNVar10[uVar32].val.m_backend.fpclass;
          if (this->m_loFree == true) {
            VVar12 = ON_LOWER;
            if (fVar28 != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_6f8,0,(type *)0x0);
              iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)(pNVar10 + uVar32),
                                 (cpp_dec_float<200U,_int,_void> *)local_6f8);
              bVar2 = iVar6 < 1;
LAB_0057940f:
              VVar12 = (VarStatus)bVar2;
              pNVar10 = (this->m_col).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .m_elem;
            }
          }
          else {
            VVar12 = ON_UPPER;
            if (fVar28 != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_6f8,0,(type *)0x0);
              iVar6 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                ((cpp_dec_float<200U,_int,_void> *)(pNVar10 + uVar32),
                                 (cpp_dec_float<200U,_int,_void> *)local_6f8);
              bVar2 = 0 < iVar6;
              goto LAB_0057940f;
            }
          }
          piVar11 = &pNVar10[uVar32].idx;
        }
        else {
          piVar11 = (int *)((long)(((this->m_col).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .m_elem)->val).m_backend.data._M_elems + lVar13);
          VVar12 = BASIC;
        }
        rStatus->data[*piVar11] = VVar12;
        uVar17 = uVar17 + 1;
        lVar13 = lVar13 + 0x84;
      } while ((long)uVar17 <
               (long)(this->m_col).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .memused);
    }
  }
  if (local_704 == 0xffffffff) {
    local_670->data[this->m_j] = this->m_loFree ^ ON_LOWER;
  }
  local_4b8._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006a69e0;
  if (local_4b8.theelem !=
      (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0) {
    free(local_4b8.theelem);
  }
  return;
}

Assistant:

void SPxMainSM<R>::FreeZeroObjVariablePS::execute(VectorBase<R>& x, VectorBase<R>& y,
      VectorBase<R>& s, VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the column and corresponding rows:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   int rIdx = m_old_i - m_col.size() + 1;

   for(int k = 0; k < m_col.size(); ++k)
   {
      int rIdx_new = m_col.index(k);
      s[rIdx] = s[rIdx_new];
      y[rIdx] = y[rIdx_new];
      rStatus[rIdx] = rStatus[rIdx_new];
      rIdx++;
   }

   // primal:
   int      domIdx = -1;
   DSVectorBase<R> slack(m_col.size());

   if(m_loFree)
   {
      R minRowUp = R(infinity);

      for(int k = 0; k < m_rows.size(); ++k)
      {
         R           val = 0.0;
         const SVectorBase<R>& row = m_rows[k];

         for(int l = 0; l < row.size(); ++l)
         {
            if(row.index(l) != m_j)
               val += row.value(l) * x[row.index(l)];
         }

         R scale = maxAbs(m_lRhs[k], val);

         if(scale < 1.0)
            scale = 1.0;

         R z = (m_lRhs[k] / scale) - (val / scale);

         if(isZero(z, this->epsilon()))
            z = 0.0;

         R up = z * scale / row[m_j];
         slack.add(k, val);

         if(up < minRowUp)
         {
            minRowUp = up;
            domIdx   = k;
         }
      }

      if(m_bnd < minRowUp)
      {
         x[m_j] = m_bnd;
         domIdx = -1;
      }
      else
         x[m_j] = minRowUp;
   }
   else
   {
      R maxRowLo = R(-infinity);

      for(int k = 0; k < m_rows.size(); ++k)
      {
         R val = 0.0;
         const SVectorBase<R>& row = m_rows[k];

         for(int l = 0; l < row.size(); ++l)
         {
            if(row.index(l) != m_j)
               val += row.value(l) * x[row.index(l)];
         }

         R scale = maxAbs(m_lRhs[k], val);

         if(scale < 1.0)
            scale = 1.0;

         R z = (m_lRhs[k] / scale) - (val / scale);

         if(isZero(z, this->epsilon()))
            z = 0.0;

         R lo = z * scale / row[m_j];
         slack.add(k, val);

         if(lo > maxRowLo)
         {
            maxRowLo = lo;
            domIdx   = k;
         }
      }

      if(m_bnd > maxRowLo)
      {
         x[m_j] = m_bnd;
         domIdx = -1;
      }
      else
         x[m_j] = maxRowLo;
   }

   for(int k = 0; k < m_col.size(); ++k)
      s[m_col.index(k)] = slack[k] + m_col.value(k) * x[m_j];

   // dual:
   r[m_j] = 0.0;

   for(int k = 0; k < m_col.size(); ++k)
   {
      int idx = m_col.index(k);
      y[idx] = m_rowObj[idx];
   }

   // basis:
   for(int k = 0; k < m_col.size(); ++k)
   {
      if(k != domIdx)
         rStatus[m_col.index(k)] = SPxSolverBase<R>::BASIC;

      else
      {
         cStatus[m_j] = SPxSolverBase<R>::BASIC;

         if(m_loFree)
            rStatus[m_col.index(k)] = (m_col.value(k) > 0) ? SPxSolverBase<R>::ON_UPPER :
                                      SPxSolverBase<R>::ON_LOWER;
         else
            rStatus[m_col.index(k)] = (m_col.value(k) > 0) ? SPxSolverBase<R>::ON_LOWER :
                                      SPxSolverBase<R>::ON_UPPER;
      }
   }

   if(domIdx == -1)
   {
      if(m_loFree)
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM20 Dimension doesn't match after this step.");
   }

#endif
}